

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::FileDescriptorToBase64_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  char *in_RCX;
  string_view input;
  string fdp_bytes;
  FileDescriptorProto fdp;
  undefined1 local_100 [16];
  compiler local_f0 [224];
  
  local_100[0] = 0;
  StripSourceRetentionOptions(local_f0,(FileDescriptor *)this,false);
  google::protobuf::MessageLite::SerializeToString((string *)local_f0);
  input._M_str = in_RCX;
  input._M_len = (size_t)local_100;
  StringToBase64_abi_cxx11_(__return_storage_ptr__,(csharp *)0x0,input);
  google::protobuf::FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::string FileDescriptorToBase64(const FileDescriptor* descriptor) {
  std::string fdp_bytes;
  FileDescriptorProto fdp = StripSourceRetentionOptions(*descriptor);
  fdp.SerializeToString(&fdp_bytes);
  return StringToBase64(fdp_bytes);
}